

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_waveform_generation.cc
# Opt level: O0

bool __thiscall
sptk::PeriodicWaveformGeneration::Get
          (PeriodicWaveformGeneration *this,double *sin,double *cos,double *sawtooth,double *pitch)

{
  bool bVar1;
  byte bVar2;
  reference pvVar3;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  double *in_RSI;
  long in_RDI;
  double *in_R8;
  double dVar4;
  double prev_phase;
  bool unvoiced;
  vector<double,_std::allocator<double>_> tmp;
  double pitch_in_current_point;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> local_50;
  value_type local_38;
  double *local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  byte local_1;
  
  local_20 = (double *)CONCAT71(in_register_00000011,in_DL);
  local_28 = (double *)CONCAT71(in_register_00000009,in_CL);
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    local_1 = 0;
  }
  else {
    local_30 = in_R8;
    local_18 = in_RSI;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10636b);
    bVar2 = (**(code **)(**(long **)(in_RDI + 0x18) + 0x20))(*(long **)(in_RDI + 0x18),&local_50);
    if (((bVar2 & 1) == 0) ||
       (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,0),
       *pvVar3 <= 0.0 && *pvVar3 != 0.0)) {
      local_1 = 0;
      bVar1 = true;
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,0);
      local_38 = *pvVar3;
      bVar1 = false;
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff90);
    if (!bVar1) {
      dVar4 = InputSourceInterpolationWithMagicNumber::GetMagicNumber
                        (*(InputSourceInterpolationWithMagicNumber **)(in_RDI + 0x18));
      bVar1 = dVar4 == local_38;
      if ((((*(byte *)(in_RDI + 0x10) & 1) == 0) && (bVar1)) &&
         ((*(byte *)(in_RDI + 0x38) & 1) != 0)) {
        local_38 = *(double *)(in_RDI + 0x30);
      }
      if (local_30 != (double *)0x0) {
        *local_30 = local_38;
      }
      dVar4 = InputSourceInterpolationWithMagicNumber::GetMagicNumber
                        (*(InputSourceInterpolationWithMagicNumber **)(in_RDI + 0x18));
      if ((dVar4 != local_38) || (NAN(dVar4) || NAN(local_38))) {
        if (local_18 != (double *)0x0) {
          dVar4 = ::sin(*(double *)(in_RDI + 0x28));
          *local_18 = dVar4;
        }
        if (local_20 != (double *)0x0) {
          dVar4 = ::cos(*(double *)(in_RDI + 0x28));
          *local_20 = dVar4;
        }
        if (local_28 != (double *)0x0) {
          *local_28 = *(double *)(in_RDI + 0x28) / 3.141592653589793 - 1.0;
        }
        if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
          *(undefined1 *)(in_RDI + 0x38) = 1;
          *(value_type *)(in_RDI + 0x30) = local_38;
        }
        dVar4 = *(double *)(in_RDI + 0x28);
        *(double *)(in_RDI + 0x28) = 6.283185307179586 / local_38 + *(double *)(in_RDI + 0x28);
        if ((((*(byte *)(in_RDI + 0x10) & 1) == 0) && (bVar1)) &&
           (((dVar4 <= 3.141592653589793 && (3.141592653589793 <= *(double *)(in_RDI + 0x28))) ||
            ((dVar4 <= 6.283185307179586 && (6.283185307179586 <= *(double *)(in_RDI + 0x28))))))) {
          *(undefined1 *)(in_RDI + 0x38) = 0;
        }
        if (6.283185307179586 < *(double *)(in_RDI + 0x28)) {
          *(double *)(in_RDI + 0x28) = *(double *)(in_RDI + 0x28) - 6.283185307179586;
        }
        local_1 = 1;
      }
      else {
        *(undefined8 *)(in_RDI + 0x28) = 0;
        if (local_18 != (double *)0x0) {
          *local_18 = *(double *)(in_RDI + 8);
        }
        if (local_20 != (double *)0x0) {
          *local_20 = *(double *)(in_RDI + 8);
        }
        if (local_28 != (double *)0x0) {
          *local_28 = *(double *)(in_RDI + 8);
        }
        local_1 = 1;
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool PeriodicWaveformGeneration::Get(double* sin, double* cos, double* sawtooth,
                                     double* pitch) {
  if (!is_valid_) {
    return false;
  }

  // Get pitch.
  double pitch_in_current_point;
  {
    std::vector<double> tmp;
    if (!input_source_->Get(&tmp) || tmp[0] < 0.0) {
      return false;
    }
    pitch_in_current_point = tmp[0];
  }

  const bool unvoiced(input_source_->GetMagicNumber() ==
                      pitch_in_current_point);
  if (!strict_ && unvoiced && extending_) {
    pitch_in_current_point = voiced_pitch_;
  }

  if (pitch) {
    *pitch = pitch_in_current_point;
  }

  // If unvoiced point, return zero.
  if (input_source_->GetMagicNumber() == pitch_in_current_point) {
    phase_ = 0.0;
    if (sin) {
      *sin = unvoiced_value_;
    }
    if (cos) {
      *cos = unvoiced_value_;
    }
    if (sawtooth) {
      *sawtooth = unvoiced_value_;
    }
    return true;
  }

  if (sin) {
    *sin = std::sin(phase_);
  }
  if (cos) {
    *cos = std::cos(phase_);
  }
  if (sawtooth) {
    *sawtooth = phase_ / sptk::kPi - 1.0;
  }

  if (!strict_) {
    extending_ = true;
    voiced_pitch_ = pitch_in_current_point;
  }

  // Proceed phase.
  const double prev_phase(phase_);
  phase_ += sptk::kTwoPi / pitch_in_current_point;
  if (!strict_ && unvoiced &&
      ((prev_phase <= sptk::kPi && sptk::kPi <= phase_) ||
       (prev_phase <= sptk::kTwoPi && sptk::kTwoPi <= phase_))) {
    extending_ = false;
  }
  if (sptk::kTwoPi < phase_) {
    phase_ -= sptk::kTwoPi;
  }

  return true;
}